

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool help_greater_vault(chunk_conflict *c,loc centre,char *name)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t local_34;
  int local_30;
  wchar_t denominator;
  wchar_t numerator;
  wchar_t i;
  char *name_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  local_30 = 1;
  local_34 = 3;
  iStack_10 = centre.y;
  bVar1 = true;
  if (iStack_10 < c->height) {
    c_local._4_4_ = centre.x;
    bVar1 = c->width <= c_local._4_4_;
  }
  if ((int)(uint)!bVar1 < dun->cent_n - dun->nstair_room) {
    centre_local.x._3_1_ = false;
  }
  else {
    for (denominator = L'Z'; c->depth < denominator; denominator = denominator + L'\xfffffff6') {
      local_30 = local_30 << 1;
      local_34 = local_34 * 3;
    }
    uVar2 = Rand_div(local_34);
    if ((int)uVar2 < local_30) {
      iVar3 = strcmp(dun->profile->name,"classic");
      if ((iVar3 == 0) || (uVar2 = Rand_div(3), uVar2 == 0)) {
        centre_local.x._3_1_ = build_vault_type(c,centre,name);
      }
      else {
        centre_local.x._3_1_ = false;
      }
    }
    else {
      centre_local.x._3_1_ = false;
    }
  }
  return centre_local.x._3_1_;
}

Assistant:

static bool help_greater_vault(struct chunk *c, struct loc centre,
		const char *name)
{
	int i;
	int numerator   = 1;
	int denominator = 3;
	
	/*
	 * Only try to build a GV as the first non-staircase room.  If not
	 * finding space, cent_n has already been incremented.
	 */
	if (dun->cent_n - dun->nstair_room > ((centre.y >= c->height ||
		centre.x >= c->width) ? 0 : 1)) return false;

	/* Level 90+ has a 1/3 chance, level 80-89 has 2/9, ... */
	for (i = 90; i > c->depth; i -= 10) {
		numerator *= 2;
		denominator *= 3;
	}

	/* Attempt to pass the depth check and build a GV */
	if (randint0(denominator) >= numerator) return false;

	/* Non-classic profiles need to adjust the probability */
	if (!streq(dun->profile->name, "classic") && !one_in_(3)) return false;

	return build_vault_type(c, centre, name);
}